

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QPointer<QMdiSubWindow>_>::relocate
          (QArrayDataPointer<QPointer<QMdiSubWindow>_> *this,qsizetype offset,
          QPointer<QMdiSubWindow> **data)

{
  QPointer<QMdiSubWindow> *d_first;
  QPointer<QMdiSubWindow> *pQVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QPointer<QMdiSubWindow>,long_long>(this->ptr,this->size,d_first);
  if (data != (QPointer<QMdiSubWindow> **)0x0) {
    pQVar1 = *data;
    if ((this->ptr <= pQVar1) && (pQVar1 < this->ptr + this->size)) {
      *data = pQVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }